

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O3

mg_point_2d * mg_point_2d_make(uint16_t srid,double x_longitude,double y_latitude)

{
  mg_point_2d *pmVar1;
  
  pmVar1 = (mg_point_2d *)mg_allocator_malloc(&mg_system_allocator,0x18);
  if (pmVar1 != (mg_point_2d *)0x0) {
    pmVar1->srid = (ulong)srid;
    pmVar1->x = x_longitude;
    pmVar1->y = y_latitude;
  }
  return pmVar1;
}

Assistant:

mg_point_2d *mg_point_2d_make(uint16_t srid, double x_longitude,
                              double y_latitude) {
  mg_point_2d *point = mg_point_2d_alloc(&mg_system_allocator);
  if (!point) {
    return NULL;
  }
  point->srid = srid;
  point->x = x_longitude;
  point->y = y_latitude;
  return point;
}